

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

bool __thiscall
ctemplate::SectionTemplateNode::AddSubnode(SectionTemplateNode *this,Template *my_template)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  char *p;
  char *pcVar7;
  ostream *poVar8;
  Template *my_template_00;
  long lVar9;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  TemplateToken token;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (my_template->state_ == TS_ERROR) {
    return false;
  }
  if ((my_template->parse_state_).bufend <= (my_template->parse_state_).bufstart) {
    if ((this->token_).text == "__{{MAIN}}__") {
      return false;
    }
    poVar8 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
    poVar8 = std::operator<<(poVar8,"Template ");
    poVar8 = std::operator<<(poVar8,(my_template->resolved_filename_)._M_dataplus._M_p);
    std::operator<<(poVar8,": ");
    poVar8 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
    poVar8 = std::operator<<(poVar8,"File ended before all sections were closed");
    std::endl<char,std::char_traits<char>>(poVar8);
    my_template->state_ = TS_ERROR;
    return false;
  }
  GetNextToken(&token,(SectionTemplateNode *)my_template,my_template);
  switch(token.type) {
  case TOKENTYPE_TEXT:
    bVar5 = AddTextNode(this,&token,my_template);
    bVar4 = std::operator==(&this->indentation_,"\n");
    pcVar2 = token.text + token.textlen;
    lVar3 = 0;
    do {
      lVar9 = lVar3;
      pcVar1 = pcVar2 + lVar9;
      if (pcVar1 <= token.text) break;
      lVar3 = lVar9 + -1;
    } while (pcVar2[lVar9 + -1] != '\n');
    pcVar7 = pcVar1;
    if ((~bVar4 & token.textlen + lVar9 == 0) == 0) {
      for (; pcVar7 < pcVar2; pcVar7 = pcVar7 + 1) {
        if ((*pcVar7 != ' ') && (*pcVar7 != '\t')) goto LAB_00121327;
      }
      if (pcVar1 < pcVar2) {
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_98,pcVar1,(long)pcVar1 - lVar9);
      }
      else {
LAB_00121327:
        std::__cxx11::string::string((string *)local_98,"",(allocator *)local_48);
      }
    }
    else {
      std::__cxx11::string::string((string *)local_98,"",(allocator *)local_48);
    }
    std::__cxx11::string::operator=((string *)&this->indentation_,(string *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    goto joined_r0x00120f53;
  case TOKENTYPE_VARIABLE:
    bVar5 = AddVariableNode(this,&token,my_template);
    (this->indentation_)._M_string_length = 0;
    *(this->indentation_)._M_dataplus._M_p = '\0';
joined_r0x00120f53:
    if (!bVar5) {
      my_template->state_ = TS_ERROR;
      goto switchD_00120e01_caseD_9;
    }
    break;
  case TOKENTYPE_SECTION_START:
    AddSectionNode(this,&token,my_template,false);
    goto LAB_001211ab;
  case TOKENTYPE_SECTION_END:
    if ((token.textlen != (this->token_).textlen) ||
       (iVar6 = bcmp(token.text,(this->token_).text,token.textlen), iVar6 != 0)) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar8 = std::operator<<(poVar8,"Template ");
      poVar8 = std::operator<<(poVar8,(my_template->resolved_filename_)._M_dataplus._M_p);
      std::operator<<(poVar8,": ");
      poVar8 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar8 = std::operator<<(poVar8,"Found end of different section than the one I am in");
      poVar8 = std::operator<<(poVar8,"\nFound: ");
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,token.text,token.text + token.textlen);
      poVar8 = std::operator<<(poVar8,(string *)local_98);
      poVar8 = std::operator<<(poVar8,"\nIn: ");
      pcVar2 = (this->token_).text;
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,pcVar2,pcVar2 + (this->token_).textlen);
      poVar8 = std::operator<<(poVar8,(string *)local_48);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)local_48);
      std::__cxx11::string::~string((string *)local_98);
      my_template->state_ = TS_ERROR;
    }
    (this->indentation_)._M_string_length = 0;
    *(this->indentation_)._M_dataplus._M_p = '\0';
  case TOKENTYPE_NULL:
switchD_00120e01_caseD_9:
    bVar5 = false;
    goto LAB_00121363;
  case TOKENTYPE_TEMPLATE:
    AddTemplateNode(this,&token,my_template,&this->indentation_);
    goto LAB_001211ab;
  case TOKENTYPE_COMMENT:
    break;
  case TOKENTYPE_SET_DELIMITERS:
    bVar5 = Template::ParseDelimiters
                      (token.text,token.textlen,&(my_template->parse_state_).current_delimiters);
    if (!bVar5) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar8 = std::operator<<(poVar8,"Template ");
      poVar8 = std::operator<<(poVar8,(my_template->resolved_filename_)._M_dataplus._M_p);
      std::operator<<(poVar8,": ");
      poVar8 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar8 = std::operator<<(poVar8,"Invalid delimiter-setting command.");
      poVar8 = std::operator<<(poVar8,"\nFound: ");
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,token.text,token.text + token.textlen);
      poVar8 = std::operator<<(poVar8,(string *)local_98);
      poVar8 = std::operator<<(poVar8,"\nIn: ");
      pcVar2 = (this->token_).text;
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,pcVar2,pcVar2 + (this->token_).textlen);
      poVar8 = std::operator<<(poVar8,(string *)local_48);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)local_48);
LAB_001212e2:
      std::__cxx11::string::~string((string *)local_98);
      my_template->state_ = TS_ERROR;
    }
    break;
  case TOKENTYPE_PRAGMA:
    bVar5 = AddPragmaNode(this,&token,my_template_00);
    if (!bVar5) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar8 = std::operator<<(poVar8,"Template ");
      poVar8 = std::operator<<(poVar8,(my_template->resolved_filename_)._M_dataplus._M_p);
      std::operator<<(poVar8,": ");
      poVar8 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar8 = std::operator<<(poVar8,"Pragma marker must be at the top of the template: \'");
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,token.text,token.text + token.textlen);
      poVar8 = std::operator<<(poVar8,(string *)local_98);
      poVar8 = std::operator<<(poVar8,"\'");
      std::endl<char,std::char_traits<char>>(poVar8);
      goto LAB_001212e2;
    }
    break;
  case TOKENTYPE_HIDDEN_DEFAULT_SECTION:
    AddSectionNode(this,&token,my_template,true);
LAB_001211ab:
    (this->indentation_)._M_string_length = 0;
    *(this->indentation_)._M_dataplus._M_p = '\0';
    break;
  default:
    poVar8 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
    poVar8 = std::operator<<(poVar8,"Template ");
    poVar8 = std::operator<<(poVar8,(my_template->resolved_filename_)._M_dataplus._M_p);
    std::operator<<(poVar8,": ");
    poVar8 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
    poVar8 = std::operator<<(poVar8,"Invalid token type returned from GetNextToken");
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  bVar5 = true;
LAB_00121363:
  std::_Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
  ~_Vector_base(&token.modvals.
                 super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
               );
  return bVar5;
}

Assistant:

bool SectionTemplateNode::AddSubnode(Template *my_template) {
  bool auto_escape_success = true;
  // Don't proceed if we already found an error
  if (my_template->state() == TS_ERROR) {
    return false;
  }

  // Stop when the buffer is empty.
  if (my_template->parse_state_.bufstart >= my_template->parse_state_.bufend) {
    // running out of file contents ends the section too
    if (token_.text != kMainSectionName) {
      // if we are not in the main section, we have a syntax error in the file
      LOG_TEMPLATE_NAME(ERROR, my_template);
      LOG(ERROR) << "File ended before all sections were closed" << endl;
      my_template->set_state(TS_ERROR);
    }
    return false;
  }

  TemplateToken token = GetNextToken(my_template);

  switch (token.type) {
    case TOKENTYPE_TEXT:
      auto_escape_success = this->AddTextNode(&token, my_template);
      // Store the indentation (trailing whitespace after a newline), if any.
      this->indentation_ = GetIndentation(token.text, token.textlen,
                                          indentation_ == "\n");
      break;
    case TOKENTYPE_VARIABLE:
      auto_escape_success = this->AddVariableNode(&token, my_template);
      this->indentation_.clear();  // clear whenever last read wasn't whitespace
      break;
    case TOKENTYPE_SECTION_START:
      auto_escape_success = this->AddSectionNode(&token, my_template, false);
      this->indentation_.clear();  // clear whenever last read wasn't whitespace
      break;
    case TOKENTYPE_HIDDEN_DEFAULT_SECTION:
      auto_escape_success = this->AddSectionNode(&token, my_template, true);
      this->indentation_.clear();  // clear whenever last read wasn't whitespace
      break;
    case TOKENTYPE_SECTION_END:
      // Don't add a node. Just make sure we are ending the right section
      // and return false to indicate the section is complete
      if (token.textlen != token_.textlen ||
          memcmp(token.text, token_.text, token.textlen)) {
        LOG_TEMPLATE_NAME(ERROR, my_template);
        LOG(ERROR) << "Found end of different section than the one I am in"
                   << "\nFound: " << string(token.text, token.textlen)
                   << "\nIn: " << string(token_.text, token_.textlen) << endl;
        my_template->set_state(TS_ERROR);
      }
      this->indentation_.clear();  // clear whenever last read wasn't whitespace
      return false;
      break;
    case TOKENTYPE_TEMPLATE:
      auto_escape_success = this->AddTemplateNode(&token, my_template,
                                                  this->indentation_);
      this->indentation_.clear();  // clear whenever last read wasn't whitespace
      break;
    case TOKENTYPE_COMMENT:
      // Do nothing. Comments just drop out of the file altogether.
      break;
    case TOKENTYPE_SET_DELIMITERS:
      if (!Template::ParseDelimiters(
              token.text, token.textlen,
              &my_template->parse_state_.current_delimiters)) {
        LOG_TEMPLATE_NAME(ERROR, my_template);
        LOG(ERROR) << "Invalid delimiter-setting command."
                   << "\nFound: " << string(token.text, token.textlen)
                   << "\nIn: " << string(token_.text, token_.textlen) << endl;
        my_template->set_state(TS_ERROR);
      }
      break;
    case TOKENTYPE_PRAGMA:
      // We can do nothing and simply drop the pragma of the file as is done
      // for comments. But, there is value in keeping it for debug purposes
      // (via DumpToString) so add it as a pragma node.
      if (!this->AddPragmaNode(&token, my_template)) {
        LOG_TEMPLATE_NAME(ERROR, my_template);
        LOG(ERROR) << "Pragma marker must be at the top of the template: '"
                   << string(token.text, token.textlen) << "'" << endl;
        my_template->set_state(TS_ERROR);
      }
      break;
    case TOKENTYPE_NULL:
      // GetNextToken either hit the end of the file or a syntax error
      // in the file. Do nothing more here. Just return false to stop
      // processing.
      return false;
      break;
    default:
      // This shouldn't happen. If it does, it's a programmer error.
      LOG_TEMPLATE_NAME(ERROR, my_template);
      LOG(ERROR) << "Invalid token type returned from GetNextToken" << endl;
  }

  if (!auto_escape_success) {
    // The error is logged where it happens. Here indicate
    // the initialization failed.
    my_template->set_state(TS_ERROR);
    return false;
  }

  // for all the cases where we did not return false
  return true;
}